

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

UString * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
          (UString *__return_storage_ptr__,Interpreter *this,LocationRange *loc)

{
  long lVar1;
  long lVar2;
  RuntimeError *__return_storage_ptr___00;
  Type t;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  if (*(int *)(this + 0x40) == 0x13) {
    lVar1 = *(long *)(this + 0x48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *(long *)(lVar1 + 0x10);
    std::__cxx11::u32string::_M_construct<char32_t*>
              ((u32string *)__return_storage_ptr__,lVar2,lVar2 + *(long *)(lVar1 + 0x18) * 4);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"expected string result, got: ",0x1d)
  ;
  type_str_abi_cxx11_(&local_1d0,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 0x40),t);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  anon_unknown_0::Stack::makeError(__return_storage_ptr___00,(Stack *)(this + 0x50),loc,&local_1d0);
  __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

UString manifestString(const LocationRange &loc)
    {
        if (scratch.t != Value::STRING) {
            std::stringstream ss;
            ss << "expected string result, got: " << type_str(scratch.t);
            throw makeError(loc, ss.str());
        }
        return static_cast<HeapString *>(scratch.v.h)->value;
    }